

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvtable.h
# Opt level: O0

ssize_t __thiscall
CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::write
          (CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  pointer this_00;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined4 in_register_00000034;
  uint i;
  const_iterator it;
  char *comma;
  vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  ostream *in_stack_ffffffffffffff98;
  uint local_3c;
  __normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_20;
  char *local_18;
  ostream *local_10;
  CSVTable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_8;
  
  local_10 = (ostream *)CONCAT44(in_register_00000034,__fd);
  local_18 = "";
  local_8 = this;
  __gnu_cxx::
  __normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::__normal_iterator(&local_20);
  local_20._M_current =
       (CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin(in_stack_ffffffffffffff88);
  while( true ) {
    std::
    vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::end(in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    in_stack_ffffffffffffff98 = std::operator<<(local_10,local_18);
    this_00 = __gnu_cxx::
              __normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator->(&local_20);
    psVar2 = CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::getHeader(this_00);
    std::operator<<(in_stack_ffffffffffffff98,(string *)psVar2);
    local_18 = ",";
    __gnu_cxx::
    __normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  for (local_3c = 0;
      local_3c <
      *(uint *)((long)&(((CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this)->header).field_2 + 8); local_3c = local_3c + 1) {
    local_18 = "";
    std::ostream::operator<<(local_10,std::endl<char,std::char_traits<char>>);
    local_20._M_current =
         (CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::begin(in_stack_ffffffffffffff88);
    while( true ) {
      std::
      vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::end(in_stack_ffffffffffffff88);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_ffffffffffffff90,
                         (__normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)in_stack_ffffffffffffff88);
      if (!bVar1) break;
      in_stack_ffffffffffffff90 = std::operator<<(local_10,local_18);
      __gnu_cxx::
      __normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator*(&local_20);
      pbVar3 = CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]((CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this,(uint)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      std::operator<<(in_stack_ffffffffffffff90,(string *)pbVar3);
      local_18 = ",";
      __gnu_cxx::
      __normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++((__normal_iterator<const_CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<CSVTableColumn<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    }
  }
  return (ulong)local_3c;
}

Assistant:

void write(std::ostream& os) const
  {
    const char* comma = "";
    typename std::vector<CSVTableColumn<Tvar> >::const_iterator it;

    for (it = columns.begin(); it != columns.end(); it++) {
      os << comma << it->getHeader();
      comma = ",";
    }

    for (unsigned i=0; i < nrows; i++) {
      comma = "";
      os << std::endl;
      for (it = columns.begin(); it != columns.end(); it++) {
	os << comma << (*it)[i];
	comma = ",";
      }
    }
  }